

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_bzip2.c
# Opt level: O2

int archive_compressor_bzip2_open(archive_write_filter *f)

{
  int *piVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  int iVar4;
  void *pvVar5;
  char *fmt;
  archive *a;
  size_t __size;
  
  piVar1 = (int *)f->data;
  pvVar5 = *(void **)(piVar1 + 0x18);
  if (pvVar5 == (void *)0x0) {
    __size = 0x10000;
    if (f->archive->magic == 0xb0c5c0de) {
      uVar3 = archive_write_get_bytes_per_block(f->archive);
      __size = (long)(int)uVar3;
      if ((uVar3 < 0x10001) && (__size = 0x10000, uVar3 != 0)) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (long)(int)uVar3;
        __size = 0x10000 - SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x10000)) % auVar2,0);
      }
    }
    *(size_t *)(piVar1 + 0x1a) = __size;
    pvVar5 = malloc(__size);
    *(void **)(piVar1 + 0x18) = pvVar5;
    if (pvVar5 == (void *)0x0) {
      archive_set_error(f->archive,0xc,"Can\'t allocate data for compression buffer");
      return -0x1e;
    }
  }
  else {
    __size = *(size_t *)(piVar1 + 0x1a);
  }
  piVar1[6] = 0;
  piVar1[7] = 0;
  piVar1[8] = 0;
  piVar1[9] = 0;
  piVar1[10] = 0;
  piVar1[0xb] = 0;
  piVar1[0xc] = 0;
  piVar1[0xd] = 0;
  piVar1[0x12] = 0;
  piVar1[0x13] = 0;
  piVar1[0x14] = 0;
  piVar1[0x15] = 0;
  piVar1[0xe] = 0;
  piVar1[0xf] = 0;
  piVar1[0x10] = 0;
  piVar1[0x11] = 0;
  piVar1[2] = 0;
  piVar1[3] = 0;
  piVar1[4] = 0;
  piVar1[5] = 0;
  *(void **)(piVar1 + 8) = pvVar5;
  piVar1[10] = (int)__size;
  f->write = archive_compressor_bzip2_write;
  iVar4 = BZ2_bzCompressInit((bz_stream *)(piVar1 + 2),*piVar1,0,0x1e);
  if (iVar4 == 0) {
    f->data = piVar1;
    return 0;
  }
  archive_set_error(f->archive,-1,"Internal error initializing compression library");
  if (iVar4 == -9) {
    a = f->archive;
    fmt = "Internal error initializing compression library: mis-compiled library";
  }
  else {
    if (iVar4 == -3) {
      a = f->archive;
      fmt = "Internal error initializing compression library: out of memory";
      iVar4 = 0xc;
      goto LAB_0052da26;
    }
    if (iVar4 != -2) {
      return -0x1e;
    }
    a = f->archive;
    fmt = "Internal error initializing compression library: invalid setup parameter";
  }
  iVar4 = -1;
LAB_0052da26:
  archive_set_error(a,iVar4,fmt);
  return -0x1e;
}

Assistant:

static int
archive_compressor_bzip2_open(struct archive_write_filter *f)
{
	struct private_data *data = (struct private_data *)f->data;
	int ret;

	if (data->compressed == NULL) {
		size_t bs = 65536, bpb;
		if (f->archive->magic == ARCHIVE_WRITE_MAGIC) {
			/* Buffer size should be a multiple number of the of bytes
			 * per block for performance. */
			bpb = archive_write_get_bytes_per_block(f->archive);
			if (bpb > bs)
				bs = bpb;
			else if (bpb != 0)
				bs -= bs % bpb;
		}
		data->compressed_buffer_size = bs;
		data->compressed
		    = (char *)malloc(data->compressed_buffer_size);
		if (data->compressed == NULL) {
			archive_set_error(f->archive, ENOMEM,
			    "Can't allocate data for compression buffer");
			return (ARCHIVE_FATAL);
		}
	}

	memset(&data->stream, 0, sizeof(data->stream));
	data->stream.next_out = data->compressed;
	data->stream.avail_out = data->compressed_buffer_size;
	f->write = archive_compressor_bzip2_write;

	/* Initialize compression library */
	ret = BZ2_bzCompressInit(&(data->stream),
	    data->compression_level, 0, 30);
	if (ret == BZ_OK) {
		f->data = data;
		return (ARCHIVE_OK);
	}

	/* Library setup failed: clean up. */
	archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
	    "Internal error initializing compression library");

	/* Override the error message if we know what really went wrong. */
	switch (ret) {
	case BZ_PARAM_ERROR:
		archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
		    "Internal error initializing compression library: "
		    "invalid setup parameter");
		break;
	case BZ_MEM_ERROR:
		archive_set_error(f->archive, ENOMEM,
		    "Internal error initializing compression library: "
		    "out of memory");
		break;
	case BZ_CONFIG_ERROR:
		archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
		    "Internal error initializing compression library: "
		    "mis-compiled library");
		break;
	}

	return (ARCHIVE_FATAL);

}